

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnp.cpp
# Opt level: O1

void __thiscall libtorrent::upnp::resend_request(upnp *this,error_code *ec)

{
  socklen_t in_ECX;
  undefined8 extraout_RDX;
  _Rb_tree_node_base *p_Var1;
  undefined1 auVar2 [16];
  shared_ptr<libtorrent::upnp> me;
  __shared_ptr<libtorrent::upnp,(__gnu_cxx::_Lock_policy)2> a_Stack_38 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  error_code local_28;
  
  if (ec->failed_ == false) {
    ::std::__shared_ptr<libtorrent::upnp,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<libtorrent::upnp,void>
              (a_Stack_38,(__weak_ptr<libtorrent::upnp,_(__gnu_cxx::_Lock_policy)2> *)this);
    if (this->m_closing == false) {
      if ((this->m_retry_count < 0xc) &&
         ((this->m_retry_count < 4 ||
          ((this->m_devices)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)))) {
        discover_device_impl(this);
      }
      else if ((this->m_devices)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
        local_28 = errors::make_error_code(no_router);
        disable(this,&local_28);
      }
      else {
        auVar2._0_8_ = (this->m_devices)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        auVar2._8_8_ = extraout_RDX;
        auVar2._0_8_ = auVar2._0_8_;
        while ((_Rb_tree_header *)auVar2._0_8_ !=
               &(this->m_devices)._M_t._M_impl.super__Rb_tree_header) {
          p_Var1 = auVar2._0_8_;
          if (((p_Var1[2]._M_parent == (_Base_ptr)0x0) && (p_Var1[8]._M_parent == (_Base_ptr)0x0))
             && (*(byte *)((long)&p_Var1[8]._M_color + 2) == 0)) {
            connect(this,auVar2._0_4_ + 0x20,auVar2._8_8_,in_ECX);
          }
          auVar2 = ::std::_Rb_tree_increment(p_Var1);
          auVar2._0_8_ = auVar2._0_8_;
        }
      }
    }
    if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
    }
  }
  return;
}

Assistant:

void upnp::resend_request(error_code const& ec)
{
	TORRENT_ASSERT(is_single_thread());
	COMPLETE_ASYNC("upnp::resend_request");
	if (ec) return;

	std::shared_ptr<upnp> me(self());

	if (m_closing) return;

	if (m_retry_count < 12
		&& (m_devices.empty() || m_retry_count < 4))
	{
		discover_device_impl();
		return;
	}

	if (m_devices.empty())
	{
		disable(errors::no_router);
		return;
	}

	for (auto const& dev : m_devices)
	{
		if (!dev.control_url.empty()
			|| dev.upnp_connection
			|| dev.disabled)
		{
			continue;
		}

		// we don't have a WANIP or WANPPP url for this device,
		// ask for it
		connect(const_cast<rootdevice&>(dev));
	}
}